

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UBool icu_63::GMTOffsetField::isValid(FieldType type,int32_t width)

{
  bool local_19;
  int32_t width_local;
  FieldType type_local;
  
  if (type == HOUR) {
    local_19 = width == 1 || width == 2;
    width_local._3_1_ = local_19;
  }
  else if ((type == MINUTE) || (type == SECOND)) {
    width_local._3_1_ = width == 2;
  }
  else {
    width_local._3_1_ = 0 < width;
  }
  return width_local._3_1_;
}

Assistant:

UBool
GMTOffsetField::isValid(FieldType type, int32_t width) {
    switch (type) {
    case HOUR:
        return (width == 1 || width == 2);
    case MINUTE:
    case SECOND:
        return (width == 2);
    default:
        U_ASSERT(FALSE);
    }
    return (width > 0);
}